

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

string * cmCMakePresetsGraph::GetFilename(string *__return_storage_ptr__,string *sourceDir)

{
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  string *local_18;
  string *sourceDir_local;
  
  local_18 = sourceDir;
  sourceDir_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_48,sourceDir);
  cmAlphaNum::cmAlphaNum(&local_78,"/CMakePresets.json");
  cmStrCat<>(__return_storage_ptr__,&local_48,&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakePresetsGraph::GetFilename(const std::string& sourceDir)
{
  return cmStrCat(sourceDir, "/CMakePresets.json");
}